

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

Mat3x3d * __thiscall
OpenMD::RigidBody::calcForcesAndTorquesAndVirial(Mat3x3d *__return_storage_ptr__,RigidBody *this)

{
  pointer ppAVar1;
  Atom *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  uint uVar10;
  int __denom;
  Vector<double,_3U> *trq_00;
  uint uVar11;
  ulong uVar12;
  Vector3d trq;
  Vector3d afrc;
  Vector3d rpos;
  Vector3d ef;
  Vector3d pos;
  Vector3d frc;
  Vector3d apos;
  Vector3d atrq;
  Vector3d dfrc;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_118;
  Vector<double,_3U> local_f8;
  AtomType *local_e0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_118);
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_f8);
  Vector<double,_3U>::Vector(&local_48);
  local_d8.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_138,local_d8.data_);
  Vector<double,_3U>::Vector(&local_a8,&local_138);
  local_c0.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_d8,local_c0.data_);
  Vector<double,_3U>::Vector(&local_138,&local_d8);
  local_60.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_c0,local_60.data_);
  Vector<double,_3U>::Vector(&local_d8,&local_c0);
  StuntDouble::getPos((Vector3d *)&local_c0,&this->super_StuntDouble);
  RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)__return_storage_ptr__,0.0);
  uVar10 = DataStorage::getStorageLayout
                     ((DataStorage *)
                      ((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                              .position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (this->super_StuntDouble).storage_));
  uVar11 = 0;
  while( true ) {
    uVar12 = (ulong)uVar11;
    ppAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar12) break;
    this_00 = ppAVar1[uVar12];
    local_e0 = this_00->atomType_;
    StuntDouble::getFrc((Vector3d *)&local_60,&this_00->super_StuntDouble);
    Vector<double,_3U>::operator=(&local_118,&local_60);
    StuntDouble::getPos((Vector3d *)&local_60,
                        &(this->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar12]->super_StuntDouble);
    Vector<double,_3U>::operator=(&local_90,&local_60);
    operator-(&local_60,&local_90,&local_c0);
    Vector3<double>::operator=((Vector3<double> *)&local_f8,&local_60);
    Vector<double,_3U>::add(&local_a8,&local_118);
    local_138.data_[0] =
         (local_118.data_[2] * local_f8.data_[1] - local_f8.data_[2] * local_118.data_[1]) +
         local_138.data_[0];
    local_138.data_[1] =
         (local_118.data_[0] * local_f8.data_[2] - local_f8.data_[0] * local_118.data_[2]) +
         local_138.data_[1];
    local_138.data_[2] =
         (local_f8.data_[0] * local_118.data_[1] - local_118.data_[0] * local_f8.data_[1]) +
         local_138.data_[2];
    bVar9 = Atom::isDirectional((this->atoms_).
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar12]);
    if (bVar9) {
      StuntDouble::getTrq((Vector3d *)&local_60,
                          &(this->atoms_).
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar12]->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_78,&local_60);
      Vector<double,_3U>::add(&local_138,&local_78);
    }
    if ((uVar10 >> 0xc & 1) != 0) {
      bVar9 = AtomType::isElectrostatic(local_e0);
      if (bVar9) {
        StuntDouble::getElectricField
                  ((Vector3d *)&local_60,
                   &(this->atoms_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12]->super_StuntDouble);
        Vector<double,_3U>::add(&local_d8,&local_60);
      }
    }
    dVar2 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[0][1];
    dVar3 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[0][2];
    dVar4 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[1][0];
    dVar5 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[1][1];
    dVar6 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[1][2];
    dVar7 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[2][0];
    dVar8 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[2][1];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [0][0] = (__return_storage_ptr__->super_SquareMatrix<double,_3>).
             super_RectMatrix<double,_3U,_3U>.data_[0][0] - local_f8.data_[0] * local_118.data_[0];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [0][1] = dVar2 - local_f8.data_[0] * local_118.data_[1];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [0][2] = dVar3 - local_118.data_[2] * local_f8.data_[0];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [1][0] = dVar4 - local_118.data_[0] * local_f8.data_[1];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [1][1] = dVar5 - local_f8.data_[1] * local_118.data_[1];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [1][2] = dVar6 - local_f8.data_[1] * local_118.data_[2];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [2][0] = dVar7 - local_f8.data_[2] * local_118.data_[0];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [2][1] = dVar8 - local_f8.data_[2] * local_118.data_[1];
    (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
    [2][2] = (__return_storage_ptr__->super_SquareMatrix<double,_3>).
             super_RectMatrix<double,_3U,_3U>.data_[2][2] - local_f8.data_[2] * local_118.data_[2];
    uVar11 = uVar11 + 1;
  }
  StuntDouble::addFrc(&this->super_StuntDouble,(Vector3d *)&local_a8);
  trq_00 = &local_138;
  StuntDouble::addTrq(&this->super_StuntDouble,(Vector3d *)trq_00);
  if ((uVar10 >> 0xc & 1) != 0) {
    Vector<double,_3U>::div(&local_d8,(int)trq_00,__denom);
    StuntDouble::setElectricField(&this->super_StuntDouble,(Vector3d *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d RigidBody::calcForcesAndTorquesAndVirial() {
    Vector3d afrc;
    Vector3d atrq;
    Vector3d apos;
    Vector3d rpos;
    Vector3d dfrc;
    Vector3d frc(0.0);
    Vector3d trq(0.0);
    Vector3d ef(0.0);
    AtomType* atype;
    int eCount = 0;

    Vector3d pos = this->getPos();
    Mat3x3d tau_(0.0);

    int sl =
        ((snapshotMan_->getCurrentSnapshot())->*storage_).getStorageLayout();

    for (unsigned int i = 0; i < atoms_.size(); i++) {
      atype = atoms_[i]->getAtomType();

      afrc = atoms_[i]->getFrc();
      apos = atoms_[i]->getPos();
      rpos = apos - pos;

      frc += afrc;

      trq[0] += rpos[1] * afrc[2] - rpos[2] * afrc[1];
      trq[1] += rpos[2] * afrc[0] - rpos[0] * afrc[2];
      trq[2] += rpos[0] * afrc[1] - rpos[1] * afrc[0];

      // If the atom has a torque associated with it, then we also need to
      // migrate the torques onto the center of mass:

      if (atoms_[i]->isDirectional()) {
        atrq = atoms_[i]->getTrq();
        trq += atrq;
      }

      if ((sl & DataStorage::dslElectricField) && (atype->isElectrostatic())) {
        ef += atoms_[i]->getElectricField();
        eCount++;
      }

      tau_(0, 0) -= rpos[0] * afrc[0];
      tau_(0, 1) -= rpos[0] * afrc[1];
      tau_(0, 2) -= rpos[0] * afrc[2];
      tau_(1, 0) -= rpos[1] * afrc[0];
      tau_(1, 1) -= rpos[1] * afrc[1];
      tau_(1, 2) -= rpos[1] * afrc[2];
      tau_(2, 0) -= rpos[2] * afrc[0];
      tau_(2, 1) -= rpos[2] * afrc[1];
      tau_(2, 2) -= rpos[2] * afrc[2];
    }
    addFrc(frc);
    addTrq(trq);

    if (sl & DataStorage::dslElectricField) {
      ef /= eCount;
      setElectricField(ef);
    }

    return tau_;
  }